

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.h
# Opt level: O0

void crnlib::utils::read_obj<unsigned_short>
               (unsigned_short *obj,void *pBuf,bool buffer_is_little_endian)

{
  undefined4 local_34;
  uint i;
  uint8 *pDst;
  uint8 *pSrc;
  bool buffer_is_little_endian_local;
  void *pBuf_local;
  unsigned_short *obj_local;
  
  if (buffer_is_little_endian) {
    *obj = *pBuf;
  }
  else {
    for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
      *(undefined1 *)((long)obj + (ulong)local_34) =
           *(undefined1 *)((long)pBuf + (1 - (ulong)local_34));
    }
  }
  return;
}

Assistant:

inline void read_obj(T& obj, const void* pBuf, bool buffer_is_little_endian)
        {
            const uint8* pSrc = reinterpret_cast<const uint8*>(pBuf);
            uint8* pDst = reinterpret_cast<uint8*>(&obj);

            if (c_crnlib_little_endian_platform == buffer_is_little_endian)
            {
                memcpy(pDst, pSrc, sizeof(T));
            }
            else
            {
                for (uint i = 0; i < sizeof(T); i++)
                {
                    pDst[i] = pSrc[sizeof(T) - 1 - i];
                }
            }
        }